

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O2

int __thiscall Parse::compoundStmt(Parse *this)

{
  int iVar1;
  int iVar2;
  DelimiterTable *pDVar3;
  mapped_type *pmVar4;
  ostream *poVar5;
  allocator local_41;
  key_type local_40;
  
  if ((this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
      super__Vector_impl_data._M_start[this->curIndex].type == DELIMTER) {
    pDVar3 = this->delimiterTable;
    std::__cxx11::string::string((string *)&local_40,"{",&local_41);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](&(pDVar3->
                           super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ).index,&local_40);
    iVar1 = *pmVar4;
    iVar2 = (this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
            super__Vector_impl_data._M_start[this->curIndex].id;
    std::__cxx11::string::~string((string *)&local_40);
    if (iVar1 == iVar2) {
      this->curIndex = this->curIndex + 1;
      localDeclarations(this);
      statementList(this);
      if ((this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
          super__Vector_impl_data._M_start[this->curIndex].type == DELIMTER) {
        pDVar3 = this->delimiterTable;
        std::__cxx11::string::string((string *)&local_40,"}",&local_41);
        pmVar4 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::operator[](&(pDVar3->
                               super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               ).index,&local_40);
        iVar1 = *pmVar4;
        iVar2 = (this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
                super__Vector_impl_data._M_start[this->curIndex].id;
        std::__cxx11::string::~string((string *)&local_40);
        if (iVar1 == iVar2) {
          this->curIndex = this->curIndex + 1;
          return 1;
        }
      }
      poVar5 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_27eaa);
      poVar5 = (ostream *)
               std::ostream::operator<<
                         (poVar5,(this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)
                                 ._M_impl.super__Vector_impl_data._M_start[this->curIndex].line + -1
                         );
      poVar5 = std::operator<<(poVar5,anon_var_dwarf_27d3a);
      std::endl<char,std::char_traits<char>>(poVar5);
      exit(0);
    }
  }
  return 0;
}

Assistant:

int Parse::compoundStmt() {
    if(tokenVec[curIndex].type == DELIMTER && delimiterTable.index["{"] == tokenVec[curIndex].id) {
        curIndex++;
        localDeclarations();
        statementList();
        if(tokenVec[curIndex].type == DELIMTER && delimiterTable.index["}"] == tokenVec[curIndex].id) {
            curIndex++;
        } else {
            //cout << tokenVec[curIndex].name << endl;
            cout << "函数定义缺少右括号在第" << tokenVec[curIndex].line- 1  << "行" << endl;
            exit(0);
        }
        return 1;
    }
    return 0;
}